

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcryptohash-gost3411.c
# Opt level: O2

void p_crypto_hash_gost3411_finish(PHashGOST3411 *ctx)

{
  uint uVar1;
  uint uVar2;
  
  uVar2 = ctx->len[0] >> 3 & 0x1f;
  uVar1 = 0x20 - uVar2;
  if ((uVar1 & 0x1f) != 0) {
    memset((void *)((long)ctx->buf + (ulong)uVar2),0,(ulong)uVar1);
    pp_crypto_hash_gost3411_process(ctx,ctx->buf);
    pp_crypto_hash_gost3411_sum_256(ctx->sum,ctx->buf);
  }
  pp_crypto_hash_gost3411_process(ctx,ctx->len);
  pp_crypto_hash_gost3411_process(ctx,ctx->sum);
  return;
}

Assistant:

void
p_crypto_hash_gost3411_finish (PHashGOST3411 *ctx)
{
	puint32	left;
	puint32	last;

	left = ctx->len[0] & 0xFF;
	last = 32 - (left >> 3);

	if (last % 32 != 0) {
		memset ((pchar *) ctx->buf + (left >> 3), 0, last);
		pp_crypto_hash_gost3411_swap_bytes (ctx->buf, 8);
		pp_crypto_hash_gost3411_process (ctx, ctx->buf);
		pp_crypto_hash_gost3411_sum_256 (ctx->sum, ctx->buf);
	}

	pp_crypto_hash_gost3411_process (ctx, ctx->len);
	pp_crypto_hash_gost3411_process (ctx, ctx->sum);

	pp_crypto_hash_gost3411_swap_bytes (ctx->hash, 8);
}